

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvTools.cpp
# Opt level: O0

void glslang::SpirvToolsEliminateDeadOutputStores
               (spv_target_env target_env,vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv
               ,unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *live_locs,
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *live_builtins,SpvBuildLogger *param_5)

{
  uint *original_binary;
  size_type original_binary_size;
  spv_optimizer_options opt_options;
  OptimizerOptions local_80;
  OptimizerOptions spvOptOptions;
  PassToken local_70;
  PassToken local_68;
  PassToken local_60;
  MessageConsumer local_58;
  Optimizer local_38;
  Optimizer optimizer;
  SpvBuildLogger *param_4_local;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *live_builtins_local;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *live_locs_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv_local;
  spv_target_env target_env_local;
  
  optimizer.impl_._M_t.
  super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>.
  _M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl =
       (unique_ptr<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>)
       (unique_ptr<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>)
       param_5;
  spvtools::Optimizer::Optimizer(&local_38,target_env);
  std::function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)>::
  function<void(&)(spv_message_level_t,char_const*,spv_position_t_const&,char_const*),void>
            ((function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)> *)
             &local_58,OptimizerMesssageConsumer);
  spvtools::Optimizer::SetMessageConsumer(&local_38,&local_58);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  ~function(&local_58);
  spvtools::CreateEliminateDeadOutputStoresPass((spvtools *)&local_60,live_locs,live_builtins);
  spvtools::Optimizer::RegisterPass(&local_38,&local_60);
  spvtools::Optimizer::PassToken::~PassToken(&local_60);
  spvtools::CreateAggressiveDCEPass((spvtools *)&local_68,false,true);
  spvtools::Optimizer::RegisterPass(&local_38,&local_68);
  spvtools::Optimizer::PassToken::~PassToken(&local_68);
  spvtools::CreateEliminateDeadOutputComponentsPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_70);
  spvtools::Optimizer::PassToken::~PassToken(&local_70);
  spvtools::CreateAggressiveDCEPass((spvtools *)&spvOptOptions,false,true);
  spvtools::Optimizer::RegisterPass(&local_38,(PassToken *)&spvOptOptions);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&spvOptOptions);
  spvtools::OptimizerOptions::OptimizerOptions(&local_80);
  spvtools::Optimizer::SetTargetEnv(&local_38,target_env);
  spvtools::OptimizerOptions::set_run_validator(&local_80,false);
  original_binary = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(spirv);
  original_binary_size = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(spirv);
  opt_options = spvtools::OptimizerOptions::operator_cast_to_spv_optimizer_options_t_(&local_80);
  spvtools::Optimizer::Run(&local_38,original_binary,original_binary_size,spirv,opt_options);
  spvtools::OptimizerOptions::~OptimizerOptions(&local_80);
  spvtools::Optimizer::~Optimizer(&local_38);
  return;
}

Assistant:

void SpirvToolsEliminateDeadOutputStores(spv_target_env target_env, std::vector<unsigned int>& spirv,
                                         std::unordered_set<uint32_t>* live_locs,
                                         std::unordered_set<uint32_t>* live_builtins,
                                         spv::SpvBuildLogger*)
{
  spvtools::Optimizer optimizer(target_env);
  optimizer.SetMessageConsumer(OptimizerMesssageConsumer);

  optimizer.RegisterPass(spvtools::CreateEliminateDeadOutputStoresPass(live_locs, live_builtins));
  optimizer.RegisterPass(spvtools::CreateAggressiveDCEPass(false, true));
  optimizer.RegisterPass(spvtools::CreateEliminateDeadOutputComponentsPass());
  optimizer.RegisterPass(spvtools::CreateAggressiveDCEPass(false, true));

  spvtools::OptimizerOptions spvOptOptions;
  optimizer.SetTargetEnv(target_env);
  spvOptOptions.set_run_validator(false);
  optimizer.Run(spirv.data(), spirv.size(), &spirv, spvOptOptions);
}